

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausBmcClauses(Clu_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  sat_solver *s;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Cnf_Dat_t *pCVar9;
  int Entry;
  int i;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  iVar2 = p->nPref;
  if (iVar2 == 0) {
    pCVar9 = p->pCnf;
    pVVar8 = p->vLits;
  }
  else {
    pCVar9 = p->pCnf;
    pVVar8 = p->vLits;
    iVar7 = pCVar9->nVars;
    for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
      pVVar8->pArray[lVar10] = pVVar8->pArray[lVar10] + iVar2 * iVar7 * 2;
    }
  }
  iVar2 = pCVar9->nVars * 2;
  piVar3 = pVVar8->pArray;
  iVar7 = 0;
  iVar11 = 0;
  do {
    iVar6 = p->nFrames;
    if (iVar6 <= iVar11) {
      iVar11 = p->nPref;
      pVVar8 = p->vLits;
      for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
        piVar3 = pVVar8->pArray + lVar10;
        *piVar3 = *piVar3 - (iVar6 + iVar11) * iVar2;
      }
      return iVar7;
    }
    iVar6 = 0;
    for (i = 0; i < p->vClauses->nSize; i = i + 1) {
      iVar4 = Vec_IntEntry(p->vClauses,i);
      iVar5 = Vec_IntEntry(p->vCosts,i);
      if (iVar5 != -1) {
        iVar5 = Vec_IntEntry(p->vCosts,i);
        if (iVar5 < 1) {
          __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                        ,0x39f,"int Fra_ClausBmcClauses(Clu_Man_t *)");
        }
        if (p->nLutSize < iVar4 - iVar6) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                        ,0x3a0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
        }
        lVar12 = (long)iVar4;
        lVar13 = (long)iVar6;
        for (lVar10 = lVar13; lVar10 < lVar12; lVar10 = lVar10 + 1) {
          *(byte *)(piVar3 + lVar10) = *(byte *)(piVar3 + lVar10) ^ 1;
        }
        iVar6 = sat_solver_solve(p->pSatBmc,piVar3 + lVar13,piVar3 + lVar12,(long)p->nBTLimit,0,0,0)
        ;
        for (; lVar13 < lVar12; lVar13 = lVar13 + 1) {
          *(byte *)(piVar3 + lVar13) = *(byte *)(piVar3 + lVar13) ^ 1;
        }
        if (iVar6 == -1) {
          s = p->pSatBmc;
          if (s->qtail != s->qhead) {
            iVar6 = sat_solver_simplify(s);
            if (iVar6 == 0) {
              __assert_fail("RetValue != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                            ,0x3bf,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
            if (p->pSatBmc->qtail != p->pSatBmc->qhead) {
              __assert_fail("p->pSatBmc->qtail == p->pSatBmc->qhead",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                            ,0x3c0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
          }
        }
        else {
          Vec_IntWriteEntry(p->vCosts,i,Entry);
          iVar7 = iVar7 + 1;
        }
      }
      iVar6 = iVar4;
    }
    pVVar8 = p->vLits;
    for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
      piVar1 = pVVar8->pArray + lVar10;
      *piVar1 = *piVar1 + iVar2;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

int Fra_ClausBmcClauses( Clu_Man_t * p )
{
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    // add the clauses
    Counter = 0;
    // skip through the prefix variables
    if ( p->nPref )
    {
        nLitsTot = p->nPref * 2 * p->pCnf->nVars;
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }
    // go through the timeframes
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );

            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatBmc, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );

            if ( RetValue != l_False )
            {
                Beg = End;
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                Counter++;
                continue;
            }
/*
            // add the clause
            RetValue = sat_solver_addclause( p->pSatBmc, pStart + Beg, pStart + End );
    //        assert( RetValue == 1 );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding BMC clauses.\n" );
                return -1;
            }
*/
            Beg = End;

            // simplify the solver
            if ( p->pSatBmc->qtail != p->pSatBmc->qhead )
            {
                RetValue = sat_solver_simplify(p->pSatBmc);
                assert( RetValue != 0 );
                assert( p->pSatBmc->qtail == p->pSatBmc->qhead );
            }
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // return clauses back to normal
    nLitsTot = (p->nPref + p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    return Counter;
}